

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MotorVoltage.cpp
# Opt level: O0

double MeasureMotorSupplyVoltage(BasePort *curPort,AmpIO *curBoard,uint index)

{
  bool bVar1;
  byte bVar2;
  uint32_t uVar3;
  int iVar4;
  ostream *poVar5;
  bool dac_lt_supply;
  nodeaddr_t dac_addr;
  uint32_t vinc;
  uint32_t volts;
  double V;
  uint index_local;
  AmpIO *curBoard_local;
  BasePort *curPort_local;
  
  uVar3 = BoardIO::GetFirmwareVersion((BoardIO *)curBoard);
  if (uVar3 < 8) {
    curPort_local = (BasePort *)0x0;
  }
  else {
    (*curPort->_vptr_BasePort[0x1d])();
    bVar1 = AmpIO::IsQLAExpanded(curBoard,index);
    if (bVar1) {
      AmpIO::WriteSafetyRelay(curBoard,true);
      AmpIO::WritePowerEnable(curBoard,true);
      AmpIO::WriteAmpEnable(curBoard,0xff,0);
      Amp1394_Sleep(1.0);
      bVar1 = AmpIO::ReadPowerStatus(curBoard,0);
      if (bVar1) {
        _vinc = (BasePort *)0x0;
        dac_addr._0_4_ = 0x1000;
        iVar4 = 0x41;
        if (index == 2) {
          iVar4 = 0x81;
        }
        for (dac_addr._4_4_ = 0; dac_addr._4_4_ < 0x10000;
            dac_addr._4_4_ = (uint)dac_addr + dac_addr._4_4_) {
          bVar2 = BoardIO::GetBoardId((BoardIO *)curBoard);
          (*curPort->_vptr_BasePort[0x24])
                    (curPort,(ulong)bVar2,(long)iVar4,(ulong)(dac_addr._4_4_ | 0x80000000));
          Amp1394_Sleep(0.001);
          bVar1 = AmpIO::ReadMotorSupplyVoltageBit(curBoard,index);
          if (!bVar1) {
            if ((uint)dac_addr < 2) break;
            dac_addr._4_4_ = dac_addr._4_4_ - (uint)dac_addr;
            dac_addr._0_4_ = (uint)dac_addr >> 1;
          }
        }
        bVar2 = BoardIO::GetBoardId((BoardIO *)curBoard);
        (*curPort->_vptr_BasePort[0x24])(curPort,(ulong)bVar2,(long)iVar4,0x80008000);
        AmpIO::WritePowerEnable(curBoard,false);
        if (dac_addr._4_4_ < 0x10000) {
          _vinc = (BasePort *)((double)dac_addr._4_4_ * 0.0008010986495765621);
        }
        curPort_local = _vinc;
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cerr,
                                 "MeasureMotorSupplyVoltage: motor supply not enabled, check safety circuit"
                                );
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        curPort_local = (BasePort *)0x0;
      }
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cerr,
                               "MeasureMotorSupplyVoltage: QLA does not support voltage measurement"
                              );
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      curPort_local = (BasePort *)0x0;
    }
  }
  return (double)curPort_local;
}

Assistant:

double MeasureMotorSupplyVoltage(BasePort *curPort, AmpIO *curBoard, unsigned int index)
{
    // Firmware version must be >= 8
    if (curBoard->GetFirmwareVersion() < 8)
        return 0.0;

    // QLA IO expander must be present (QLA 1.5+)
    curPort->ReadAllBoards();
    if (!curBoard->IsQLAExpanded(index)) {
        std::cerr << "MeasureMotorSupplyVoltage: QLA does not support voltage measurement" << std::endl;
        return 0.0;
    }

    // Make sure board power is on and amplifier power is off
    curBoard->WriteSafetyRelay(true);
    curBoard->WritePowerEnable(true);
    curBoard->WriteAmpEnable(0xff, 0);
    Amp1394_Sleep(1.0);
    if (!curBoard->ReadPowerStatus()) {
        std::cerr << "MeasureMotorSupplyVoltage: motor supply not enabled, check safety circuit" << std::endl;
        return 0.0;
    }

    double V = 0.0;    // Measured voltage (in volts)
    uint32_t volts;    // Measured voltage (in bits)
    uint32_t vinc = 0x1000;
    nodeaddr_t dac_addr = (index == 2) ? 0x81 : 0x41;
    for (volts = 0; volts <= 0x0000ffff; volts += vinc) {
        // Write voltage to DAC 4 or 8 (for DQLA)
        curPort->WriteQuadlet(curBoard->GetBoardId(), dac_addr, volts | 0x80000000);
        Amp1394_Sleep(0.001);
        bool dac_lt_supply = curBoard->ReadMotorSupplyVoltageBit(index);
        if (!dac_lt_supply) {
            // if DAC voltage greater than supply,
            // backup and reduce resolution
            if (vinc <= 1) break;
            volts -= vinc;
            vinc >>= 1;
        }
    }
    curPort->WriteQuadlet(curBoard->GetBoardId(), dac_addr, 0x80008000);
    curBoard->WritePowerEnable(false);
    if (volts <= 0x0000ffff)
        V = volts*bits2volts;
    return V;
}